

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pnet.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  undefined8 *in_RSI;
  int in_EDI;
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> crowd_points;
  Mat bgr;
  char *imagepath;
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> *in_stack_00000240;
  Mat *in_stack_00000248;
  allocator *this;
  allocator local_99;
  string local_98 [32];
  string local_78 [96];
  char *local_18;
  int local_4;
  
  local_4 = 0;
  if (in_EDI == 2) {
    pcVar1 = (char *)in_RSI[1];
    this = &local_99;
    local_18 = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar1,this);
    cv::imread(local_78,(int)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) == 0) {
      std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::vector
                ((vector<CrowdPoint,_std::allocator<CrowdPoint>_> *)0x160a35);
      detect_crowd(in_stack_00000248,in_stack_00000240);
      draw_result((Mat *)crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<CrowdPoint,_std::allocator<CrowdPoint>_> *)
                  crowd_points.super__Vector_base<CrowdPoint,_std::allocator<CrowdPoint>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      local_4 = 0;
      std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::~vector
                ((vector<CrowdPoint,_std::allocator<CrowdPoint>_> *)this);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",local_18);
      local_4 = -1;
    }
    cv::Mat::~Mat((Mat *)local_78);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat bgr = cv::imread(imagepath, 1);
    if (bgr.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<CrowdPoint> crowd_points;
    detect_crowd(bgr, crowd_points);
    draw_result(bgr, crowd_points);

    return 0;
}